

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.h
# Opt level: O2

void __thiscall cmCMakePath::cmCMakePath(cmCMakePath *this,string_view source,format fmt)

{
  undefined7 in_register_00000009;
  format in_R8B;
  string_view path;
  string sStack_28;
  
  path._M_str._1_7_ = in_register_00000009;
  path._M_str._0_1_ = fmt;
  path._M_len = source._M_str;
  FormatPath_abi_cxx11_(&sStack_28,(cmCMakePath *)source._M_len,path,in_R8B);
  std::filesystem::__cxx11::path::path(&this->Path,&sStack_28,auto_format);
  std::__cxx11::string::~string((string *)&sStack_28);
  return;
}

Assistant:

cmCMakePath(cm::string_view source, format fmt = generic_format) noexcept
    : Path(FormatPath(source, fmt))
  {
  }